

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-rasterize.c
# Opt level: O0

PVG_FT_Outline *
ft_outline_convert(plutovg_path_t *path,plutovg_matrix_t *matrix,plutovg_stroke_data_t *stroke_data)

{
  _Bool _Var1;
  plutovg_path_command_t pVar2;
  PVG_FT_Outline *outline;
  plutovg_point_t points [3];
  undefined1 local_38 [8];
  plutovg_path_iterator_t it;
  plutovg_stroke_data_t *stroke_data_local;
  plutovg_matrix_t *matrix_local;
  plutovg_path_t *path_local;
  
  it._8_8_ = stroke_data;
  if (stroke_data == (plutovg_stroke_data_t *)0x0) {
    plutovg_path_iterator_init((plutovg_path_iterator_t *)local_38,path);
    path_local = (plutovg_path_t *)ft_outline_create(path->num_points,path->num_contours);
    while (_Var1 = plutovg_path_iterator_has_next((plutovg_path_iterator_t *)local_38), _Var1) {
      pVar2 = plutovg_path_iterator_next
                        ((plutovg_path_iterator_t *)local_38,(plutovg_point_t *)&outline);
      switch(pVar2) {
      case PLUTOVG_PATH_COMMAND_MOVE_TO:
        plutovg_matrix_map_points(matrix,(plutovg_point_t *)&outline,(plutovg_point_t *)&outline,1);
        ft_outline_move_to((PVG_FT_Outline *)path_local,outline._0_4_,outline._4_4_);
        break;
      case PLUTOVG_PATH_COMMAND_LINE_TO:
        plutovg_matrix_map_points(matrix,(plutovg_point_t *)&outline,(plutovg_point_t *)&outline,1);
        ft_outline_line_to((PVG_FT_Outline *)path_local,outline._0_4_,outline._4_4_);
        break;
      case PLUTOVG_PATH_COMMAND_CUBIC_TO:
        plutovg_matrix_map_points(matrix,(plutovg_point_t *)&outline,(plutovg_point_t *)&outline,3);
        ft_outline_cubic_to((PVG_FT_Outline *)path_local,outline._0_4_,outline._4_4_,points[0].x,
                            points[0].y,points[1].x,points[1].y);
        break;
      case PLUTOVG_PATH_COMMAND_CLOSE:
        ft_outline_close((PVG_FT_Outline *)path_local);
      }
    }
    ft_outline_end((PVG_FT_Outline *)path_local);
  }
  else {
    path_local = (plutovg_path_t *)ft_outline_convert_stroke(path,matrix,stroke_data);
  }
  return (PVG_FT_Outline *)path_local;
}

Assistant:

static PVG_FT_Outline* ft_outline_convert(const plutovg_path_t* path, const plutovg_matrix_t* matrix, const plutovg_stroke_data_t* stroke_data)
{
    if(stroke_data) {
        return ft_outline_convert_stroke(path, matrix, stroke_data);
    }

    plutovg_path_iterator_t it;
    plutovg_path_iterator_init(&it, path);

    plutovg_point_t points[3];
    PVG_FT_Outline* outline = ft_outline_create(path->num_points, path->num_contours);
    while(plutovg_path_iterator_has_next(&it)) {
        switch(plutovg_path_iterator_next(&it, points)) {
        case PLUTOVG_PATH_COMMAND_MOVE_TO:
            plutovg_matrix_map_points(matrix, points, points, 1);
            ft_outline_move_to(outline, points[0].x, points[0].y);
            break;
        case PLUTOVG_PATH_COMMAND_LINE_TO:
            plutovg_matrix_map_points(matrix, points, points, 1);
            ft_outline_line_to(outline, points[0].x, points[0].y);
            break;
        case PLUTOVG_PATH_COMMAND_CUBIC_TO:
            plutovg_matrix_map_points(matrix, points, points, 3);
            ft_outline_cubic_to(outline, points[0].x, points[0].y, points[1].x, points[1].y, points[2].x, points[2].y);
            break;
        case PLUTOVG_PATH_COMMAND_CLOSE:
            ft_outline_close(outline);
            break;
        }
    }

    ft_outline_end(outline);
    return outline;
}